

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O2

node_ids_t * __thiscall
libtorrent::dht::extract_node_ids
          (node_ids_t *__return_storage_ptr__,dht *this,bdecode_node *e,string_view key)

{
  bool bVar1;
  type_t tVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int i;
  string_view sVar6;
  string_view key_00;
  char *in;
  address addr;
  bdecode_node nids;
  node_id id;
  bdecode_node nid;
  char *local_120;
  address local_118;
  undefined8 local_f0;
  undefined8 uStack_e8;
  unsigned_long local_e0;
  undefined1 local_d8 [24];
  bdecode_token *pbStack_c0;
  digest32<160L> local_8c;
  bdecode_node local_78;
  
  key_00._M_str = (char *)key._M_len;
  tVar2 = bdecode_node::type((bdecode_node *)this);
  if (tVar2 == dict_t) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar6._M_str = key_00._M_str;
    sVar6._M_len = (size_t)e;
    sVar6 = bdecode_node::dict_find_string_value((bdecode_node *)this,sVar6,(string_view)ZEXT816(0))
    ;
    pcVar5 = sVar6._M_str;
    if (sVar6._M_len == 0x14) {
      local_d8._16_8_ = 0;
      pbStack_c0 = (bdecode_token *)0x0;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = 0;
      local_78.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)(pcVar5 + 0x10);
      local_78.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)pcVar5;
      local_78.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(pcVar5 + 8);
      ::std::
      vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
      ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>>
                ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                  *)__return_storage_ptr__,(address *)local_d8,(digest32<160L> *)&local_78);
    }
    else {
      key_00._M_len = (size_t)e;
      bdecode_node::dict_find_list((bdecode_node *)local_d8,(bdecode_node *)this,key_00);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_d8);
      if (bVar1) {
        i = 0;
        while( true ) {
          iVar3 = bdecode_node::list_size((bdecode_node *)local_d8);
          if (iVar3 <= i) break;
          bdecode_node::list_at(&local_78,(bdecode_node *)local_d8,i);
          tVar2 = bdecode_node::type(&local_78);
          if (tVar2 == string_t) {
            iVar3 = bdecode_node::string_length(&local_78);
            if (0x13 < iVar3) {
              local_120 = bdecode_node::string_ptr(&local_78);
              digest32<160L>::digest32(&local_8c,local_120);
              local_120 = local_120 + 0x14;
              local_118.ipv6_address_.addr_.__in6_u._8_8_ = 0;
              local_118.ipv6_address_.scope_id_ = 0;
              local_118.type_ = ipv4;
              local_118.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
              local_118.ipv6_address_.addr_.__in6_u._0_8_ = 0;
              iVar3 = bdecode_node::string_length(&local_78);
              if (iVar3 == 0x18) {
                uVar4 = aux::read_impl<unsigned_int,char_const*>(&local_120);
                local_118._0_8_ =
                     (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18) << 0x20;
                local_118.ipv6_address_.addr_.__in6_u._0_8_ = 0;
                local_118.ipv6_address_.addr_.__in6_u._8_8_ = 0;
                local_118.ipv6_address_.scope_id_ = 0;
              }
              else {
                iVar3 = bdecode_node::string_length(&local_78);
                if (iVar3 != 0x24) goto LAB_00350c8f;
                aux::read_v6_address<char_const*&>(&local_120);
                local_118.type_ = ipv6;
                local_118.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
                local_118.ipv6_address_.addr_.__in6_u._0_8_ = local_f0;
                local_118.ipv6_address_.addr_.__in6_u._8_8_ = uStack_e8;
                local_118.ipv6_address_.scope_id_ = local_e0;
              }
              ::std::
              vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
              ::emplace_back<boost::asio::ip::address&,libtorrent::digest32<160l>&>
                        ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                          *)__return_storage_ptr__,&local_118,&local_8c);
            }
          }
LAB_00350c8f:
          ::std::
          _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           *)&local_78);
          i = i + 1;
        }
      }
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)local_d8);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

node_ids_t extract_node_ids(bdecode_node const& e, string_view key)
	{
		if (e.type() != bdecode_node::dict_t) return node_ids_t();
		node_ids_t ret;
		// first look for an old-style nid
		auto const old_nid = e.dict_find_string_value(key);
		if (old_nid.size() == 20)
		{
			ret.emplace_back(address(), node_id(old_nid));
			return ret;
		}
		auto const nids = e.dict_find_list(key);
		if (!nids) return ret;
		for (int i = 0; i < nids.list_size(); i++)
		{
			bdecode_node nid = nids.list_at(i);
			if (nid.type() != bdecode_node::string_t) continue;
			if (nid.string_length() < 20) continue;
			char const* in = nid.string_ptr();
			node_id id(in);
			in += id.size();
			address addr;
			if (nid.string_length() == 24)
				addr = aux::read_v4_address(in);
			else if (nid.string_length() == 36)
				addr = aux::read_v6_address(in);
			else
				continue;
			ret.emplace_back(addr, id);
		}

		return ret;
	}